

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void google::protobuf::internal::MapMergeFrom<std::__cxx11::string,std::__cxx11::string>
               (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *dest,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *src)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  const_iterator __begin0;
  UntypedMapIterator local_30;
  
  UntypedMapBase::begin(&local_30,(UntypedMapBase *)src);
  while (local_30.node_ != (NodeBase *)0x0) {
    pbVar1 = Map<std::__cxx11::string,std::__cxx11::string>::operator[]<std::__cxx11::string>
                       ((Map<std::__cxx11::string,std::__cxx11::string> *)dest,
                        (key_arg<std::__cxx11::basic_string<char>_> *)(local_30.node_ + 1));
    std::__cxx11::string::_M_assign((string *)pbVar1);
    UntypedMapIterator::PlusPlus(&local_30);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}